

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

AppendResult __thiscall metaf::CloudGroup::appendCeiling(CloudGroup *this,string *group)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  long lVar3;
  AppendResult AVar4;
  byte bVar5;
  Unit UVar6;
  _Optional_payload_base<unsigned_int> _Var7;
  _Optional_payload_base<unsigned_int> _Var8;
  Unit UVar9;
  smatch match;
  string_type local_80;
  _Optional_payload_base<unsigned_int> local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if (group->_M_string_length == 3) {
    iVar2 = std::__cxx11::string::compare((char *)group);
    if (iVar2 == 0) {
      return GROUP_INVALIDATED;
    }
    if (2 < group->_M_string_length) {
      lVar3 = 0;
      iVar2 = 0;
      while (bVar5 = (group->_M_dataplus)._M_p[lVar3] - 0x30, bVar5 < 10) {
        iVar2 = (uint)bVar5 + iVar2 * 10;
        lVar3 = lVar3 + 1;
        if ((int)lVar3 == 3) {
          (this->heightOrVertVis).distModifier = NONE;
          (this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_payload_base<unsigned_int>)((ulong)(uint)(iVar2 * 100) | 0x100000000);
          (this->heightOrVertVis).distUnit = FEET;
          this->incompleteText = CIG_NUM;
          return APPENDED;
        }
      }
    }
  }
  if ((appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,"(\\d\\d\\d)V(\\d\\d\\d)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_58,
                     &appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  AVar4 = GROUP_INVALIDATED;
  if (!bVar1) goto LAB_001a8eaf;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_80,&local_58,1);
  if (local_80._M_string_length == 3) {
    iVar2 = std::__cxx11::string::compare((char *)&local_80);
    bVar1 = true;
    UVar6 = FEET;
    _Var8._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    if (iVar2 != 0) {
      if (local_80._M_string_length < 3) goto LAB_001a8d53;
      lVar3 = 0;
      iVar2 = 0;
      do {
        if (9 < (byte)(local_80._M_dataplus._M_p[lVar3] - 0x30U)) goto LAB_001a8d53;
        iVar2 = (uint)(byte)(local_80._M_dataplus._M_p[lVar3] - 0x30U) + iVar2 * 10;
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 3);
      _Var8 = (_Optional_payload_base<unsigned_int>)((ulong)(uint)(iVar2 * 100) | 0x100000000);
    }
  }
  else {
LAB_001a8d53:
    _Var8._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    UVar6 = METERS;
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) goto LAB_001a8eaf;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_80,&local_58,2);
  local_60 = _Var8;
  if (local_80._M_string_length == 3) {
    iVar2 = std::__cxx11::string::compare((char *)&local_80);
    bVar1 = true;
    UVar9 = FEET;
    _Var7._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var7._M_engaged = false;
    _Var7._5_3_ = 0;
    if (iVar2 != 0) {
      if (local_80._M_string_length < 3) goto LAB_001a8e63;
      lVar3 = 0;
      iVar2 = 0;
      do {
        if (9 < (byte)(local_80._M_dataplus._M_p[lVar3] - 0x30U)) goto LAB_001a8e63;
        iVar2 = (uint)(byte)(local_80._M_dataplus._M_p[lVar3] - 0x30U) + iVar2 * 10;
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 3);
      _Var7 = (_Optional_payload_base<unsigned_int>)((ulong)(uint)(iVar2 * 100) | 0x100000000);
    }
  }
  else {
LAB_001a8e63:
    _Var7._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var7._M_engaged = false;
    _Var7._5_3_ = 0;
    UVar9 = METERS;
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    AVar4 = APPENDED;
    (this->heightOrVertVis).distModifier = NONE;
    (this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = local_60;
    (this->heightOrVertVis).distUnit = UVar6;
    (this->maxHt).distModifier = NONE;
    (this->maxHt).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = _Var7;
    (this->maxHt).distUnit = UVar9;
    this->tp = VARIABLE_CEILING;
    this->incompleteText = CIG_NUM;
  }
LAB_001a8eaf:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return AVar4;
}

Assistant:

AppendResult CloudGroup::appendCeiling(const std::string & group) {
	if (const auto d = Distance::fromHeightString(group); d.has_value()) {
		if (!d->isReported()) return AppendResult::GROUP_INVALIDATED;
		heightOrVertVis = *d;
		incompleteText = IncompleteText::CIG_NUM;
		return AppendResult::APPENDED;
	}
	static const std::regex rgx ("(\\d\\d\\d)V(\\d\\d\\d)");
	static const auto matchMinHeight = 1, matchMaxHeight = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return AppendResult::GROUP_INVALIDATED;
	const auto minH = Distance::fromHeightString(match.str(matchMinHeight));
	if (!minH.has_value()) return AppendResult::GROUP_INVALIDATED;
	const auto maxH = Distance::fromHeightString(match.str(matchMaxHeight));
	if (!maxH.has_value()) return AppendResult::GROUP_INVALIDATED;
	heightOrVertVis = *minH;
	maxHt = *maxH;
	tp = Type::VARIABLE_CEILING;
	incompleteText = IncompleteText::CIG_NUM;
	return AppendResult::APPENDED;
}